

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamReader_p.cpp
# Opt level: O0

bool __thiscall BamTools::Internal::BamReaderPrivate::Open(BamReaderPrivate *this,string *filename)

{
  int64_t iVar1;
  string *in_RSI;
  int64_t *in_RDI;
  string message;
  string error;
  BamException *e;
  BgzfStream *in_stack_fffffffffffffec8;
  OpenMode in_stack_ffffffffffffff84;
  string *in_stack_ffffffffffffff88;
  BgzfStream *in_stack_ffffffffffffff90;
  BamReaderPrivate *in_stack_ffffffffffffff98;
  BamReaderPrivate *in_stack_ffffffffffffffa0;
  
  Close(in_stack_ffffffffffffff98);
  BgzfStream::Open(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
  LoadHeaderData((BamReaderPrivate *)0x1af895);
  LoadReferenceData(in_stack_ffffffffffffffa0);
  std::__cxx11::string::operator=((string *)(in_RDI + 1),in_RSI);
  iVar1 = BgzfStream::Tell(in_stack_fffffffffffffec8);
  *in_RDI = iVar1;
  return true;
}

Assistant:

bool BamReaderPrivate::Open(const string& filename) {

    try {

        // make sure we're starting with fresh state
        Close();

        // open BgzfStream
        m_stream.Open(filename, IBamIODevice::ReadOnly);

        // load BAM metadata
        LoadHeaderData();
        LoadReferenceData();

        // store filename & offset of first alignment
        m_filename = filename;
        m_alignmentsBeginOffset = m_stream.Tell();

        // return success
        return true;

    } catch ( BamException& e ) {
        const string error = e.what();
        const string message = string("could not open file: ") + filename +
                               "\n\t" + error;
        SetErrorString("BamReader::Open", message);
        return false;
    }
}